

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

LinkedSection * smalldata_section(GlobalVars *gv)

{
  LinkedSection *pLVar1;
  LinkedSection *pLVar2;
  LinkedSection *pLVar3;
  LinkedSection *pLVar4;
  LinkedSection *pLVar5;
  
  pLVar4 = (LinkedSection *)(gv->lnksec).first;
  pLVar5 = (LinkedSection *)(pLVar4->n).next;
  if (pLVar5 == (LinkedSection *)0x0) {
    pLVar3 = (LinkedSection *)0x0;
    pLVar2 = (LinkedSection *)0x0;
  }
  else {
    pLVar2 = (LinkedSection *)0x0;
    pLVar3 = (LinkedSection *)0x0;
    do {
      if (((pLVar4->flags & 1) != 0) && (pLVar4->size != 0)) {
        if (pLVar2 == (LinkedSection *)0x0) {
          pLVar2 = pLVar4;
        }
        if ((pLVar4->type == '\x02') || (pLVar3 == (LinkedSection *)0x0 && pLVar4->type == '\x03'))
        {
          pLVar3 = pLVar4;
        }
        if ((pLVar4->flags & 4) != 0) {
          return pLVar4;
        }
      }
      pLVar1 = (LinkedSection *)(pLVar5->n).next;
      pLVar4 = pLVar5;
      pLVar5 = pLVar1;
    } while (pLVar1 != (LinkedSection *)0x0);
  }
  if (pLVar3 != (LinkedSection *)0x0) {
    pLVar2 = pLVar3;
  }
  return pLVar2;
}

Assistant:

struct LinkedSection *smalldata_section(struct GlobalVars *gv)
/* Return pointer to first small data LinkedSection. If not existing, */
/* return first data/bss section or the first section. */
{
  struct LinkedSection *ls = (struct LinkedSection *)gv->lnksec.first;
  struct LinkedSection *ldls=NULL,*firstls=NULL,*nextls;

  while (nextls = (struct LinkedSection *)ls->n.next) {
    if ((ls->flags & SF_ALLOC) && ls->size!=0) {
      if (firstls == NULL)
        firstls = ls;
      if (ls->type==ST_DATA || ls->type==ST_UDATA && ldls==NULL)
        ldls = ls;
      if (ls->flags & SF_SMALLDATA)  /* first SD section found! */
        return ls;
    }
    ls = nextls;
  }
  return ldls ? ldls : firstls;
}